

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O3

int __thiscall QtMWidgets::Picker::findData(Picker *this,QVariant *data,int role,MatchFlags flags)

{
  PickerPrivate *pPVar1;
  QAbstractItemModel *pQVar2;
  iterator iVar3;
  int iVar4;
  QModelIndex start;
  QList<QModelIndex> local_78;
  QModelIndex local_60;
  undefined1 local_48 [24];
  
  pPVar1 = (this->d).d;
  pQVar2 = pPVar1->model;
  iVar4 = pPVar1->modelColumn;
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_60,&pPVar1->root);
  (**(code **)(*(long *)pQVar2 + 0x60))(local_48,pQVar2,0,iVar4,&local_60);
  pQVar2 = ((this->d).d)->model;
  (**(code **)(*(long *)pQVar2 + 0x150))(&local_60,pQVar2,local_48,role,data,1,flags.i);
  local_78.d.d = (Data *)local_60._0_8_;
  local_78.d.ptr = (QModelIndex *)local_60.i;
  local_78.d.size = (qsizetype)local_60.m;
  if (local_60.m == (QAbstractItemModel *)0x0) {
    iVar4 = -1;
  }
  else {
    iVar3 = QList<QModelIndex>::begin(&local_78);
    iVar4 = (iVar3.i)->r;
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,0x18,8);
    }
  }
  return iVar4;
}

Assistant:

int
Picker::findData( const QVariant & data, int role, Qt::MatchFlags flags ) const
{
	QModelIndexList result;

	QModelIndex start = d->model->index( 0, d->modelColumn, d->root );

	result = d->model->match( start, role, data, 1, flags );

	if( result.isEmpty() )
		return -1;

	return result.first().row();
}